

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O1

void __thiscall cinatra::coro_http_connection::build_ws_handshake_head(coro_http_connection *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined1 *puVar5;
  byte *pbVar6;
  size_t i;
  long lVar7;
  undefined1 *puVar8;
  char *pcVar9;
  coro_http_response *this_00;
  ulong __n;
  size_t sVar10;
  ulong uVar11;
  undefined8 *__src;
  byte *pbVar12;
  string_view key;
  string_view sVar13;
  char accept_key [29];
  uint8_t sha1buf [20];
  size_type __dnew;
  uint8_t key_src [60];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  undefined1 local_168 [8];
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined8 uStack_154;
  sha1_context local_148;
  byte local_d8 [32];
  size_type local_b8 [8];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  
  sVar13._M_str = "sec-websocket-key";
  sVar13._M_len = 0x11;
  sVar13 = coro_http_request::get_header_value(&this->request_,sVar13);
  pcVar9 = sVar13._M_str;
  local_78 = *(undefined8 *)pcVar9;
  uStack_70 = *(undefined8 *)(pcVar9 + 8);
  __src = &local_78;
  local_68 = *(undefined8 *)(pcVar9 + 0x10);
  local_60 = 0x3541464145383532;
  uStack_58 = 0x37342d343139452d;
  local_50 = 0x2d414335392d4144;
  uStack_48 = 0x3843443042413543;
  local_40 = 0x31314235;
  local_148.buflen = 0;
  local_148.blocks = 0;
  local_148.digest[0] = 0x67452301;
  local_148.digest[1] = 0xefcdab89;
  local_148.digest[2] = 0x98badcfe;
  local_148.digest[3] = 0x10325476;
  local_148.digest[4] = 0xc3d2e1f0;
  uVar11 = 0x3c;
  do {
    __n = 0x40 - local_148.buflen;
    if (uVar11 <= 0x40 - local_148.buflen) {
      __n = uVar11;
    }
    memcpy(local_148.buf + local_148.buflen,__src,__n);
    sVar10 = local_148.buflen + __n;
    local_148.buflen = sVar10;
    if (sVar10 == 0x40) {
      local_148.buflen = 0;
      lVar7 = 0;
      do {
        uVar4 = *(uint *)(local_148.buf + lVar7 * 4);
        *(uint *)((long)local_b8 + lVar7 * 4) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      sha1::transform<void>(local_148.digest,(uint32_t *)local_b8);
      uVar11 = uVar11 - __n;
      __src = (undefined8 *)((long)__src + __n);
      local_148.blocks = local_148.blocks + 1;
    }
  } while (sVar10 == 0x40);
  finish<void>(&local_148,local_d8);
  uVar11 = 0x14;
  puVar5 = local_168;
  pbVar6 = local_d8;
  do {
    pbVar12 = pbVar6;
    puVar8 = puVar5;
    bVar1 = *pbVar12;
    bVar2 = pbVar12[1];
    bVar3 = pbVar12[2];
    *puVar8 = code_utils::MAP[bVar1 >> 2];
    puVar8[1] = code_utils::MAP[((uint)bVar2 * 0x100 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
    puVar8[2] = code_utils::MAP[(uint)bVar2 * 0x100 + (uint)bVar3 >> 6 & 0x3f];
    puVar8[3] = code_utils::MAP[bVar3 & 0x3f];
    uVar11 = uVar11 - 3;
    puVar5 = puVar8 + 4;
    pbVar6 = pbVar12 + 3;
  } while (2 < uVar11);
  bVar1 = pbVar12[3];
  puVar8[4] = code_utils::MAP[bVar1 >> 2];
  bVar2 = pbVar12[4];
  puVar8[5] = code_utils::MAP[((uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
  puVar8[6] = code_utils::MAP[(ulong)(bVar2 & 0xf) * 4];
  *(undefined2 *)(puVar8 + 7) = 0x3d;
  this_00 = &this->response_;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"","");
  coro_http_response::set_status_and_content
            (this_00,switching_protocols,&local_188,none,(string_view)(ZEXT816(0x18a14f) << 0x40));
  build_ws_handshake_head();
  coro_http_response::add_header<char_const*,char_const*>(this_00,"Upgrade","WebSocket");
  coro_http_response::add_header<char_const*,char_const*>(this_00,"Connection","Upgrade");
  local_b8[0] = 0x1c;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_1a8,local_b8,0);
  local_1a8.field_2._M_allocated_capacity = local_b8[0];
  *(ulong *)(local_1a8._M_dataplus._M_p + 0xc) = CONCAT44(uStack_158,uStack_15c);
  *(undefined8 *)(local_1a8._M_dataplus._M_p + 0x14) = uStack_154;
  *(undefined1 (*) [8])local_1a8._M_dataplus._M_p = local_168;
  *(ulong *)(local_1a8._M_dataplus._M_p + 8) = CONCAT44(uStack_15c,uStack_160);
  local_1a8._M_string_length = local_b8[0];
  local_1a8._M_dataplus._M_p[local_b8[0]] = '\0';
  coro_http_response::add_header<char_const*,std::__cxx11::string>
            (this_00,"Sec-WebSocket-Accept",&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  key._M_str = "sec-websocket-protocol";
  key._M_len = 0x16;
  sVar13 = coro_http_request::get_header_value(&this->request_,key);
  if (sVar13._M_len != 0) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,sVar13._M_str,sVar13._M_str + sVar13._M_len);
    coro_http_response::add_header<char_const*,std::__cxx11::string>
              (this_00,"Sec-WebSocket-Protocol",&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void build_ws_handshake_head() {
    uint8_t sha1buf[20], key_src[60];
    char accept_key[29];

    std::memcpy(key_src, request_.get_header_value("sec-websocket-key").data(),
                24);
    std::memcpy(key_src + 24, ws_guid, 36);
    sha1_context ctx;
    init(ctx);
    update(ctx, key_src, sizeof(key_src));
    finish(ctx, sha1buf);

    code_utils::base64_encode(accept_key, sha1buf, sizeof(sha1buf), 0);

    response_.set_status_and_content(status_type::switching_protocols, "");

    response_.add_header("Upgrade", "WebSocket");
    response_.add_header("Connection", "Upgrade");
    response_.add_header("Sec-WebSocket-Accept", std::string(accept_key, 28));
    auto protocal_str = request_.get_header_value("sec-websocket-protocol");
#ifdef CINATRA_ENABLE_GZIP
    if (is_client_ws_compressed_) {
      response_.add_header("Sec-WebSocket-Extensions",
                           "permessage-deflate; client_no_context_takeover");
    }
#endif
    if (!protocal_str.empty()) {
      response_.add_header("Sec-WebSocket-Protocol", std::string(protocal_str));
    }
  }